

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

mbedtls_md_info_t * mbedtls_md_info_from_string(char *md_name)

{
  int iVar1;
  
  if (md_name != (char *)0x0) {
    iVar1 = strcmp("MD5",md_name);
    if (iVar1 == 0) {
      return &mbedtls_md5_info;
    }
    iVar1 = strcmp("RIPEMD160",md_name);
    if (iVar1 == 0) {
      return &mbedtls_ripemd160_info;
    }
    iVar1 = strcmp("SHA1",md_name);
    if (iVar1 == 0) {
      return &mbedtls_sha1_info;
    }
    iVar1 = strcmp("SHA",md_name);
    if (iVar1 == 0) {
      return &mbedtls_sha1_info;
    }
    iVar1 = strcmp("SHA224",md_name);
    if (iVar1 == 0) {
      return &mbedtls_sha224_info;
    }
    iVar1 = strcmp("SHA256",md_name);
    if (iVar1 == 0) {
      return &mbedtls_sha256_info;
    }
    iVar1 = strcmp("SHA384",md_name);
    if (iVar1 == 0) {
      return &mbedtls_sha384_info;
    }
    iVar1 = strcmp("SHA512",md_name);
    if (iVar1 == 0) {
      return &mbedtls_sha512_info;
    }
  }
  return (mbedtls_md_info_t *)0x0;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_string( const char *md_name )
{
    if( NULL == md_name )
        return( NULL );

    /* Get the appropriate digest information */
#if defined(MBEDTLS_MD2_C)
    if( !strcmp( "MD2", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_MD2 );
#endif
#if defined(MBEDTLS_MD4_C)
    if( !strcmp( "MD4", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_MD4 );
#endif
#if defined(MBEDTLS_MD5_C)
    if( !strcmp( "MD5", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_MD5 );
#endif
#if defined(MBEDTLS_RIPEMD160_C)
    if( !strcmp( "RIPEMD160", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_RIPEMD160 );
#endif
#if defined(MBEDTLS_SHA1_C)
    if( !strcmp( "SHA1", md_name ) || !strcmp( "SHA", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );
#endif
#if defined(MBEDTLS_SHA256_C)
    if( !strcmp( "SHA224", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA224 );
    if( !strcmp( "SHA256", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 );
#endif
#if defined(MBEDTLS_SHA512_C)
    if( !strcmp( "SHA384", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA384 );
    if( !strcmp( "SHA512", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA512 );
#endif
    return( NULL );
}